

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  char cVar1;
  uint32_t uVar2;
  long lVar3;
  lua_State *plVar4;
  TRef TVar5;
  int iVar6;
  TRef TVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  cTValue *o;
  uint uVar12;
  ulong uVar13;
  IRRef1 IVar14;
  
  uVar13 = (ulong)*(uint *)((long)J->fn + (ulong)uv * 4 + 0x14);
  TVar5 = getcurrf(J);
  IVar14 = (IRRef1)TVar5;
  if (*(char *)(uVar13 + 7) != '\0') {
    o = (cTValue *)(ulong)*(uint *)(uVar13 + 0x10);
    uVar2 = (o->field_2).it;
    if ((1 < uVar2 + 0xd) && (uVar2 != 0xfffffff9)) {
      if (uVar2 == 0xfffffff5) {
        if ((*(byte *)((ulong)(o->u32).lo + 4) & 0x90) != 0) goto LAB_0012688d;
        lVar3 = *(long *)(ulong)J[-1].bpropcache[9].mode;
        lVar8 = (ulong)*(ushort *)((ulong)(o->u32).lo + 6) * 0x10;
        if ((*(uint *)(lVar3 + lVar8) < 0x60000000) && (0x10 < *(uint *)(lVar3 + lVar8 + 4)))
        goto LAB_0012688d;
      }
      if ((short)IVar14 < 0) {
        if (0x5f < J->pt->flags) goto LAB_0012688d;
        TVar5 = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
        (J->fold).ins.field_0.ot = 0x888;
        (J->fold).ins.field_0.op1 = IVar14;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        lj_opt_fold(J);
        J->base[-1] = TVar5 | 0x10000;
        o = (cTValue *)(ulong)*(uint *)(uVar13 + 0x10);
      }
      IVar14 = (IRRef1)TVar5;
      TVar5 = lj_record_constify(J,o);
      if (TVar5 != 0) {
        return TVar5;
      }
    }
  }
LAB_0012688d:
  uVar12 = *(uint *)(uVar13 + 0x14) + 0xfb3ee249;
  iVar6 = (*(uint *)(uVar13 + 0x14) ^ uVar12) - (uVar12 * 0x4000 | uVar12 >> 0x12);
  cVar1 = *(char *)(uVar13 + 6);
  if (cVar1 == '\0') {
    uVar9 = *(uint *)(uVar13 + 0x10);
    plVar4 = J->L;
    if (((plVar4->stack).ptr32 <= uVar9) && (uVar9 < (plVar4->maxstack).ptr32)) {
      iVar11 = (int)((ulong)uVar9 - (long)(plVar4->base + -J->baseslot) >> 3);
      if (-1 < iVar11) {
        iVar11 = iVar11 - J->baseslot;
        if (val == 0) {
          TVar5 = J->base[iVar11];
          if (TVar5 != 0) {
            return TVar5;
          }
          TVar5 = sload(J,iVar11);
          return TVar5;
        }
        J->base[iVar11] = val;
        if (iVar11 < (int)J->maxslot) {
          return 0;
        }
        J->maxslot = iVar11 + 1;
        return 0;
      }
    }
    (J->fold).ins.field_0.ot = 0x3c85;
  }
  else {
    (J->fold).ins.field_0.ot = 0x3d85;
  }
  (J->fold).ins.field_0.op1 = IVar14;
  (J->fold).ins.field_0.op2 =
       ((ushort)(uVar12 >> 0xd) ^ (ushort)iVar6) - (ushort)((uint)iVar6 >> 0x13) & 0xff |
       (ushort)(uv << 8);
  TVar5 = lj_opt_fold(J);
  IVar14 = (IRRef1)TVar5;
  if (val == 0) {
    uVar12 = *(uint *)((ulong)*(uint *)(uVar13 + 0x10) + 4);
    uVar9 = 3;
    if ((uVar12 & 0xffff8000) != 0xffff0000) {
      uVar9 = ~uVar12;
    }
    uVar10 = 0xe;
    if (0xfffefffe < uVar12) {
      uVar10 = uVar9;
    }
    (J->fold).ins.field_0.ot = (ushort)uVar10 | 0x4280;
    (J->fold).ins.field_0.op1 = IVar14;
    (J->fold).ins.field_0.op2 = 0;
    TVar7 = lj_opt_fold(J);
    TVar5 = uVar10 * 0xffffff + 0x7fff;
    if (2 < uVar10) {
      TVar5 = TVar7;
    }
  }
  else {
    uVar12 = val >> 0x18 & 0x1f;
    if (uVar12 - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
      val = lj_opt_fold(J);
      uVar12 = val >> 0x18 & 0x1f;
    }
    (J->fold).ins.field_0.ot = (short)uVar12 + 0x4900;
    (J->fold).ins.field_0.op1 = IVar14;
    (J->fold).ins.field_0.op2 = (IRRef1)val;
    lj_opt_fold(J);
    if ((cVar1 != '\0') && (uVar12 - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5300;
      (J->fold).ins.field_0.op1 = IVar14;
      (J->fold).ins.field_0.op2 = (IRRef1)val;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    TVar5 = 0;
  }
  return TVar5;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lua_assert(val == 0);
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
      J->base[-1] = TREF_FRAME | kfunc;
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	/* NYI: add IR to guard that it's still aliasing the same slot. */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_P32), fn, uv));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_P32), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}